

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if_conversion.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::IfConversion::CheckPhiUsers(IfConversion *this,Instruction *phi,BasicBlock *block)

{
  bool bVar1;
  DefUseManager *this_00;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  this_00 = Pass::get_def_use_mgr(&this->super_Pass);
  local_28 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/if_conversion.cpp:188:12)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/if_conversion.cpp:188:12)>
             ::_M_manager;
  local_40._M_unused._M_object = block;
  local_40._8_8_ = this;
  bVar1 = analysis::DefUseManager::WhileEachUser
                    (this_00,phi,(function<bool_(spvtools::opt::Instruction_*)> *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return bVar1;
}

Assistant:

bool IfConversion::CheckPhiUsers(Instruction* phi, BasicBlock* block) {
  return get_def_use_mgr()->WhileEachUser(
      phi, [block, this](Instruction* user) {
        if (user->opcode() == spv::Op::OpPhi &&
            context()->get_instr_block(user) == block)
          return false;
        return true;
      });
}